

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

void Abc_TtMask(word *pTruth,int nWords,int nBits)

{
  word wVar1;
  ulong uVar2;
  ulong uVar3;
  
  if ((uint)nWords < 0x201) {
    uVar3 = (ulong)(uint)nWords;
    uVar2 = 0;
    while (uVar2 != 0x200) {
      wVar1 = 0xffffffffffffffff;
      if (uVar3 < uVar2 + 0x40) {
        if (uVar2 < uVar3) {
          wVar1 = Abc_Tt6Mask(nWords);
        }
        else {
          wVar1 = 0;
        }
      }
      *pTruth = wVar1;
      pTruth = pTruth + 1;
      nWords = nWords + -0x40;
      uVar2 = uVar2 + 0x40;
    }
    return;
  }
  __assert_fail("nBits >= 0 && nBits <= nWords * 64",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                ,0xc6,"void Abc_TtMask(word *, int, int)");
}

Assistant:

static inline void Abc_TtMask( word * pTruth, int nWords, int nBits )
{ 
    int w;
    assert( nBits >= 0 && nBits <= nWords * 64 );
    for ( w = 0; w < nWords; w++ )
        if ( nBits >= (w + 1) * 64 )
            pTruth[w] = ~(word)0;
        else if ( nBits > w * 64 )
            pTruth[w] = Abc_Tt6Mask( nBits - w * 64 );
        else
            pTruth[w] = 0;
}